

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

MapcodeError decoderEngine(DecodeRec *dec,int parseFlags)

{
  double *pdVar1;
  bool bVar2;
  MapcodeError MVar3;
  int iVar4;
  int iVar5;
  Territory TVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  char *__s;
  char *pcVar11;
  Point32 PVar12;
  long lVar13;
  Point PVar14;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  undefined1 local_c8 [8];
  MapcodeZone z;
  TerritoryBoundary prevu;
  MapcodeZone zfound;
  double local_68;
  double local_60;
  int local_58;
  int local_54;
  int j;
  int nrZoneOverlaps;
  int r;
  int codexi;
  Territory parent;
  int wasAllDigits;
  char *s;
  int i;
  int upto;
  int from;
  int codex;
  MapcodeError err;
  Territory ccode;
  int parseFlags_local;
  DecodeRec *dec_local;
  
  bVar2 = false;
  MVar3 = parseMapcodeString(&dec->mapcodeElements,dec->orginput,parseFlags,dec->context);
  if (MVar3 != ERR_OK) {
    (dec->mapcodeElements).territoryISO[0] = '\0';
    (dec->mapcodeElements).properMapcode[0] = '\0';
    (dec->mapcodeElements).precisionExtension[0] = '\0';
    return MVar3;
  }
  codex = (dec->mapcodeElements).territoryCode;
  dec->context = codex;
  dec->mapcode = (dec->mapcodeElements).properMapcode;
  dec->extension = (dec->mapcodeElements).precisionExtension;
  iVar4 = (dec->mapcodeElements).indexOfDot;
  sVar10 = strlen((dec->mapcodeElements).properMapcode);
  iVar4 = iVar4 * 9 + (int)sVar10 + -1;
  __s = (dec->mapcodeElements).properMapcode;
  pcVar11 = strchr(__s,0x41);
  if (((pcVar11 != (char *)0x0) || (pcVar11 = strchr(__s,0x45), pcVar11 != (char *)0x0)) ||
     (pcVar11 = strchr(__s,0x55), pcVar11 != (char *)0x0)) {
    iVar5 = unpackIfAllDigits(__s);
    if (iVar5 < 1) {
      return ERR_INVALID_VOWEL;
    }
    bVar2 = true;
  }
  if (0x36 < iVar4) {
    return ERR_MAPCODE_UNDECODABLE;
  }
  if (iVar4 == 0x36) {
    codex = 0x5fd;
  }
  else {
    if (codex < _TERRITORY_MIN) {
      return ERR_MISSING_TERRITORY;
    }
    iVar5 = isSubdivision(codex);
    if ((iVar5 != 0) &&
       ((TVar6 = parentTerritoryOf(codex), iVar4 == 0x2c ||
        (((iVar4 == 0x22 || (iVar4 == 0x2b)) &&
         ((TVar6 == TERRITORY_IND || (TVar6 == TERRITORY_MEX)))))))) {
      codex = TVar6;
    }
  }
  iVar5 = firstRec(codex);
  iVar7 = lastRec(codex);
  from = -0x60;
  for (s._4_4_ = iVar5; s._4_4_ <= iVar7; s._4_4_ = s._4_4_ + 1) {
    iVar8 = coDex(s._4_4_);
    uVar9 = TERRITORY_BOUNDARIES[s._4_4_].flags >> 7 & 3;
    if (uVar9 == 0) {
      if ((TERRITORY_BOUNDARIES[s._4_4_].flags & 0x40U) == 0) {
        if ((iVar8 == iVar4) || ((iVar4 == 0x16 && (iVar8 == 0x15)))) {
          from = decodeGrid(dec,s._4_4_,0);
          restrictZoneTo(&dec->zone,&dec->zone,TERRITORY_BOUNDARIES + iVar7);
          if ((from == ERR_OK) && ((TERRITORY_BOUNDARIES[s._4_4_].flags & 0x200U) != 0)) {
            local_54 = 0;
            PVar14 = getMidPointFractions(&dec->zone);
            local_68 = PVar14.lat;
            (dec->result).lat = local_68;
            local_60 = PVar14.lon;
            (dec->result).lon = local_60;
            PVar12 = convertFractionsToCoord32(&dec->result);
            dec->coord32 = PVar12;
            local_58 = s._4_4_;
            goto LAB_001d3bcc;
          }
          break;
        }
      }
      else if ((((iVar8 == 0x15) && (iVar4 == 0x16)) || ((iVar8 == 0x16 && (iVar4 == 0x20)))) ||
              ((iVar8 == 0xd && (iVar4 == 0x17)))) {
        from = decodeNameless(dec,s._4_4_);
        break;
      }
    }
    else if (uVar9 == 1) {
      if ((iVar4 == iVar8 + 10) &&
         ("0123456789BCDFGHJKLMNPQRSTVWXYZAEU"
          [(int)(TERRITORY_BOUNDARIES[s._4_4_].flags >> 0xb & 0x1f)] == *__s)) {
        from = decodeGrid(dec,s._4_4_,1);
        break;
      }
    }
    else if (((iVar4 == 0x17) && (iVar8 == 0x16)) || ((iVar4 == 0x21 && (iVar8 == 0x17)))) {
      from = decodeAutoHeader(dec,s._4_4_);
      break;
    }
  }
  goto LAB_001d3dd6;
  while (((TERRITORY_BOUNDARIES[local_58].flags & 0x200U) != 0 ||
         (iVar4 = fitsInsideBoundaries(&dec->coord32,TERRITORY_BOUNDARIES + local_58), iVar4 == 0)))
  {
LAB_001d3bcc:
    local_58 = local_58 + -1;
    if (local_58 < iVar5) goto LAB_001d3c2f;
  }
  local_54 = 1;
LAB_001d3c2f:
  local_58 = iVar5;
  if (local_54 == 0) {
    for (; local_58 < s._4_4_; local_58 = local_58 + 1) {
      if (((TERRITORY_BOUNDARIES[local_58].flags & 0x200U) == 0) &&
         (iVar4 = restrictZoneTo((MapcodeZone *)local_c8,&dec->zone,TERRITORY_BOUNDARIES + local_58)
         , iVar4 != 0)) {
        local_54 = local_54 + 1;
        if (local_54 != 1) break;
        zoneCopyFrom((MapcodeZone *)&prevu.maxy,(MapcodeZone *)local_c8);
        lVar13 = (long)local_58;
        z.fmaxx._4_4_ = TERRITORY_BOUNDARIES[lVar13].minx;
        unique0x00012004 = TERRITORY_BOUNDARIES[lVar13].miny;
        prevu.minx = TERRITORY_BOUNDARIES[lVar13].maxx;
        prevu.miny = TERRITORY_BOUNDARIES[lVar13].maxy;
        prevu.maxx = TERRITORY_BOUNDARIES[lVar13].flags;
      }
    }
    if (local_54 == 1) {
      zoneCopyFrom(&dec->zone,(MapcodeZone *)&prevu.maxy);
    }
  }
  if (local_54 == 0) {
    from = -0x60;
  }
LAB_001d3dd6:
  if (from == 0) {
    iVar4 = lastRec(codex);
    restrictZoneTo(&dec->zone,&dec->zone,TERRITORY_BOUNDARIES + iVar4);
    iVar4 = isEmpty(&dec->zone);
    if (iVar4 != 0) {
      from = -0x60;
    }
  }
  if (from == 0) {
    PVar14 = getMidPointFractions(&dec->zone);
    local_d8 = PVar14.lat;
    (dec->result).lat = local_d8;
    local_d0 = PVar14.lon;
    (dec->result).lon = local_d0;
    PVar14 = convertFractionsToDegrees(&dec->result);
    local_e8 = PVar14.lat;
    (dec->result).lat = local_e8;
    local_e0 = PVar14.lon;
    (dec->result).lon = local_e0;
    if ((dec->result).lat <= -90.0 && (dec->result).lat != -90.0) {
      (dec->result).lat = -90.0;
    }
    if (90.0 < (dec->result).lat) {
      (dec->result).lat = 90.0;
    }
    pdVar1 = &(dec->result).lon;
    if (*pdVar1 <= -180.0 && *pdVar1 != -180.0) {
      (dec->result).lon = (dec->result).lon + 360.0;
    }
    if (180.0 <= (dec->result).lon) {
      (dec->result).lon = (dec->result).lon - 360.0;
    }
    if (bVar2) {
      repackIfAllDigits((dec->mapcodeElements).properMapcode,0);
    }
    dec_local._4_4_ = ERR_OK;
  }
  else {
    (dec->result).lon = 0.0;
    (dec->result).lat = 0.0;
    dec_local._4_4_ = from;
  }
  return dec_local._4_4_;
}

Assistant:

static enum MapcodeError decoderEngine(DecodeRec *dec, int parseFlags) {
    enum Territory ccode;
    enum MapcodeError err;
    int codex;
    int from;
    int upto;
    int i;
    char *s;
    int wasAllDigits = 0;
    ASSERT(dec);

    err = parseMapcodeString(&dec->mapcodeElements, dec->orginput, parseFlags, dec->context);
    if (err) { // clear all parsed fields in case of error
        dec->mapcodeElements.territoryISO[0] = 0;
        dec->mapcodeElements.properMapcode[0] = 0;
        dec->mapcodeElements.precisionExtension[0] = 0;
        return err;
    }

    ccode = dec->mapcodeElements.territoryCode;
    dec->context = ccode;
    dec->mapcode = dec->mapcodeElements.properMapcode;
    dec->extension = dec->mapcodeElements.precisionExtension;
    codex = dec->mapcodeElements.indexOfDot * 9 + (int) strlen(dec->mapcodeElements.properMapcode) - 1;
    s = dec->mapcodeElements.properMapcode;

    if (strchr(s, 'A') || strchr(s, 'E') || strchr(s, 'U')) {
        if (unpackIfAllDigits(s) <= 0) {
            return ERR_INVALID_VOWEL;
        }
        wasAllDigits = 1;
    }

    if (codex > 54) {
        ASSERT(codex == 55);
        return ERR_MAPCODE_UNDECODABLE;
    } else if (codex == 54) {
        // international mapcodes must be in international context
        ccode = TERRITORY_AAA;
    } else if (ccode < _TERRITORY_MIN) {
        return ERR_MISSING_TERRITORY;
    } else if (isSubdivision(ccode)) {
        // int mapcodes must be interpreted in the parent of a subdivision
        enum Territory parent = parentTerritoryOf(ccode);
        if ((codex == 44) || ((codex == 34 || codex == 43) && (parent == TERRITORY_IND || parent == TERRITORY_MEX))) {
            ccode = parent;
        }
    }

    from = firstRec(ccode);
    upto = lastRec(ccode);

    // try all ccode rectangles to decode s (pointing to first character of proper mapcode), assume not decodable
    err = ERR_MAPCODE_UNDECODABLE;
    for (i = from; i <= upto; i++) {
        const int codexi = coDex(i);
        const int r = REC_TYPE(i);
        if (r == 0) {
            if (IS_NAMELESS(i)) {
                if (((codexi == 21) && (codex == 22)) ||
                    ((codexi == 22) && (codex == 32)) ||
                    ((codexi == 13) && (codex == 23))) {
                    err = decodeNameless(dec, i);
                    break;
                }
            } else {
                if ((codexi == codex) || ((codex == 22) && (codexi == 21))) {
                    err = decodeGrid(dec, i, 0);

                    // first of all, make sure the zone fits the country
                    restrictZoneTo(&dec->zone, &dec->zone, TERRITORY_BOUNDARY(upto));

                    if ((err == ERR_OK) && IS_RESTRICTED(i)) {
                        int nrZoneOverlaps = 0;
                        int j;

                        // *** make sure decode fits somewhere ***
                        dec->result = getMidPointFractions(&dec->zone);
                        dec->coord32 = convertFractionsToCoord32(&dec->result);
                        for (j = i - 1; j >= from; j--) { // look in previous rects
                            if (!IS_RESTRICTED(j)) {
                                if (fitsInsideBoundaries(&dec->coord32, TERRITORY_BOUNDARY(j))) {
                                    nrZoneOverlaps = 1;
                                    break;
                                }
                            }
                        }

                        if (!nrZoneOverlaps) {
                            MapcodeZone zfound;
                            TerritoryBoundary prevu;
                            for (j = from; j < i; j++) { // try all smaller rectangles j
                                if (!IS_RESTRICTED(j)) {
                                    MapcodeZone z;
                                    if (restrictZoneTo(&z, &dec->zone, TERRITORY_BOUNDARY(j))) {
                                        nrZoneOverlaps++;
                                        if (nrZoneOverlaps == 1) {
                                            // first fit! remember...
                                            zoneCopyFrom(&zfound, &z);
                                            ASSERT(j <= MAPCODE_BOUNDARY_MAX);
                                            memcpy(&prevu, TERRITORY_BOUNDARY(j), sizeof(TerritoryBoundary));
                                        } else { // nrZoneOverlaps >= 2
                                            // more than one hit
                                            break; // give up
                                        }
                                    }
                                } // IS_RESTRICTED
                            } // for j

                            // if several sub-areas intersect, just return the whole zone
                            // (the center of which may NOT re-encode to the same mapcode!)
                            if (nrZoneOverlaps == 1) { // found exactly ONE intersection?
                                zoneCopyFrom(&dec->zone, &zfound);
                            }
                        }

                        if (!nrZoneOverlaps) {
                            err = ERR_MAPCODE_UNDECODABLE; // type 3 "NLD L222.222"
                        }
                    }  // *** make sure decode fits somewhere ***
                    break;
                }
            }
        } else if (r == 1) {
            if (codex == codexi + 10 && HEADER_LETTER(i) == *s) {
                err = decodeGrid(dec, i, 1);
                break;
            }
        } else { //r>1
            if (((codex == 23) && (codexi == 22)) ||
                ((codex == 33) && (codexi == 23))) {
                err = decodeAutoHeader(dec, i);
                break;
            }
        }
    } // for

    if (!err) {
        restrictZoneTo(&dec->zone, &dec->zone, TERRITORY_BOUNDARY(lastRec(ccode)));

        if (isEmpty(&dec->zone)) {
            err = ERR_MAPCODE_UNDECODABLE; // type 0 "BRA xx.xx"
        }
    }

    if (err) {
        dec->result.lat = dec->result.lon = 0;
        return err;
    }

    dec->result = getMidPointFractions(&dec->zone);
    dec->result = convertFractionsToDegrees(&dec->result);

    // normalise between =180 and 180
    if (dec->result.lat < -90.0) {
        dec->result.lat = -90.0;
    }
    if (dec->result.lat > 90.0) {
        dec->result.lat = 90.0;
    }
    if (dec->result.lon < -180.0) {
        dec->result.lon += 360.0;
    }
    if (dec->result.lon >= 180.0) {
        dec->result.lon -= 360.0;
    }

    if (wasAllDigits) {
        repackIfAllDigits(dec->mapcodeElements.properMapcode, 0);
    }
    return ERR_OK;
}